

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O3

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,string *err)

{
  bool bVar1;
  DyndepFile ddf;
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  _Stack_38;
  
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = LoadDyndeps(this,node,(DyndepFile *)&_Stack_38,err);
  std::
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  ::~_Rb_tree(&_Stack_38);
  return bVar1;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, std::string* err) const {
  DyndepFile ddf;
  return LoadDyndeps(node, &ddf, err);
}